

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::verifyBufferContent
          (FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  long lVar5;
  int local_2c;
  GLint i;
  GLint *buffer;
  bool is_ok;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  buffer._7_1_ = true;
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x7d2);
  lVar5 = (**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x7d5);
  local_2c = 0;
  do {
    if (3 < local_2c) {
LAB_01214b47:
      (**(code **)(lVar4 + 0x1670))(0x8c8e);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glUnmapBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x7e2);
      (**(code **)(lVar4 + 0x40))(0x8c8e,0);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x7e5);
      return buffer._7_1_;
    }
    if (*(int *)(lVar5 + (long)local_2c * 4) != local_2c) {
      buffer._7_1_ = false;
      goto LAB_01214b47;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool FunctionalTest::verifyBufferContent()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok = true;

	/* Mapping buffer object to the user-space. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLint* buffer = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	for (glw::GLint i = 0; i < 4 /* Number of emitted vertices. */; ++i)
	{
		if (buffer[i] != i)
		{
			is_ok = false;

			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	return is_ok;
}